

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::clear(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  
  if (this->nStored != 0) {
    lVar5 = 0x10;
    uVar4 = 0;
    do {
      pbVar2 = this->ptr;
      if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->field_2
        ;
      }
      plVar1 = *(long **)((long)pbVar2 + lVar5 + -0x10);
      plVar3 = (long *)((long)&pbVar2->_M_dataplus + lVar5);
      if (plVar3 != plVar1) {
        operator_delete(plVar1,*plVar3 + 1);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < this->nStored);
  }
  this->nStored = 0;
  return;
}

Assistant:

void clear() {
        for (int i = 0; i < nStored; ++i)
            alloc.destroy(begin() + i);
        nStored = 0;
    }